

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_LdCustomSpreadIteratorList(Var aRight,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ThreadContext *this;
  bool bVar3;
  int iVar4;
  Attributes attributes;
  BOOL BVar5;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  RecyclableObject *pRVar6;
  JavascriptMethod p_Var7;
  JavascriptArray *pJVar8;
  JavascriptMethod p_Var9;
  Recycler *pRVar10;
  SpreadArgument *this_01;
  DynamicType *type;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (((aRight != (Var)0x0) &&
      (bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(aRight), bVar3)) &&
     (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(aRight),
     this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  JavascriptLibrary::EnsureArrayBuiltInsAreReady
            ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  pRVar6 = ToObject(aRight,scriptContext);
  pRVar6 = GetIteratorFunction(pRVar6,scriptContext,false);
  p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
  bVar3 = JavascriptArray::IsNonES5Array(aRight);
  if (((bVar3) &&
      (bVar3 = JavascriptLibrary::IsDefaultArrayValuesFunction(pRVar6,scriptContext), bVar3)) &&
     ((pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight),
      (((pJVar8->head).ptr)->next).ptr == (SparseArraySegmentBase *)0x0 &&
      (pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight), ((pJVar8->head).ptr)->left == 0)))) {
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight);
    TVar2 = ((pJVar8->head).ptr)->length;
    pJVar8 = VarTo<Js::JavascriptArray>(aRight);
    if (TVar2 != (pJVar8->super_ArrayObject).length) goto LAB_00aa8cbb;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight);
    bVar3 = JavascriptArray::HasNoMissingValues(pJVar8);
    if (!bVar3) goto LAB_00aa8cbb;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight);
    iVar4 = (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar8);
    if (iVar4 != 0) goto LAB_00aa8cbb;
LAB_00aa8cd8:
    bVar3 = JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(scriptContext);
    if (!bVar3) {
      local_60 = (undefined1  [8])&SpreadArgument::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_4e91f59;
      data.filename._0_4_ = 0x635;
      pRVar10 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60)
      ;
      this_01 = (SpreadArgument *)new<Memory::Recycler>(0x28,pRVar10,0x387914);
      type = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->SpreadArgumentType).ptr;
      bVar3 = true;
      goto LAB_00aa8ec1;
    }
  }
  else {
LAB_00aa8cbb:
    bVar3 = VarIs<Js::TypedArrayBase>(aRight);
    if ((bVar3) &&
       (p_Var9 = FunctionInfo::GetOriginalEntryPoint
                           ((FunctionInfo *)TypedArrayBase::EntryInfo::Values), p_Var7 == p_Var9))
    goto LAB_00aa8cd8;
  }
  this = scriptContext->threadContext;
  data._39_1_ = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(pRVar6);
  bVar3 = ThreadContext::HasNoSideEffect(this,pRVar6,attributes);
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    CheckIsExecutable(pRVar6,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    aRight = (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000001,0,0,0,0,0x2000001,aRight);
    bVar3 = ThreadContext::IsOnStack(aRight);
LAB_00aa8d84:
    if (bVar3 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (this->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
      CheckIsExecutable(pRVar6,p_Var7);
      p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
      aRight = (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000001,0,0,0,0,0x2000001,aRight);
      bVar3 = ThreadContext::IsOnStack(aRight);
      goto LAB_00aa8d84;
    }
    IVar1 = this->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    CheckIsExecutable(pRVar6,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    aRight = (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000001,0,0,0,0,0x2000001,aRight);
    this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    aRight = (((((((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  this->reentrancySafeOrHandled = (bool)data._39_1_;
  BVar5 = IsObject(aRight);
  if (BVar5 == 0) {
    bVar3 = ThreadContext::RecordImplicitException(this);
    if (!bVar3) {
      return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
  }
  local_60 = (undefined1  [8])&SpreadArgument::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4e91f59;
  data.filename._0_4_ = 0x649;
  pRVar10 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this_01 = (SpreadArgument *)new<Memory::Recycler>(0x28,pRVar10,0x387914);
  type = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->SpreadArgumentType).ptr;
  bVar3 = false;
LAB_00aa8ec1:
  SpreadArgument::SpreadArgument(this_01,aRight,bVar3,type);
  return this_01;
}

Assistant:

Var JavascriptOperators::OP_LdCustomSpreadIteratorList(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ToSpreadedFunctionArgument);
#if ENABLE_COPYONACCESS_ARRAY
        // We know we're going to read from this array. Do the conversion before we try to perform checks on the head segment.
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(aRight);
#endif

#ifdef ENABLE_JS_BUILTINS
        scriptContext->GetLibrary()->EnsureArrayBuiltInsAreReady();
#endif

        RecyclableObject* function = GetIteratorFunction(aRight, scriptContext);
        JavascriptMethod method = function->GetEntryPoint();
        if (((JavascriptArray::IsNonES5Array(aRight) &&
              (
                  JavascriptLibrary::IsDefaultArrayValuesFunction(function, scriptContext)
                  // Verify that the head segment of the array covers all elements with no gaps.
                  // Accessing an element on the prototype could have side-effects that would invalidate the optimization.
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->next == nullptr
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->left == 0
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->length == VarTo<JavascriptArray>(aRight)->GetLength()
                  && UnsafeVarTo<JavascriptArray>(aRight)->HasNoMissingValues()
                  && !UnsafeVarTo<JavascriptArray>(aRight)->IsCrossSiteObject()
              )) ||
             (VarIs<TypedArrayBase>(aRight) && method == TypedArrayBase::EntryInfo::Values.GetOriginalEntryPoint()))
            // We can't optimize away the iterator if the array iterator prototype is user defined.
            && !JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(scriptContext))
        {
            return RecyclerNew(scriptContext->GetRecycler(), SpreadArgument, aRight, true /*useDirectCall*/, scriptContext->GetLibrary()->GetSpreadArgumentType());
        }

        ThreadContext *threadContext = scriptContext->GetThreadContext();

        Var iteratorVar =
            threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Var
            {
                return CALL_FUNCTION(threadContext, function, CallInfo(Js::CallFlags_Value, 1), aRight);
            });

        if (!JavascriptOperators::IsObject(iteratorVar))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return RecyclerNew(scriptContext->GetRecycler(), SpreadArgument, iteratorVar, false /*useDirectCall*/, scriptContext->GetLibrary()->GetSpreadArgumentType());
        JIT_HELPER_END(Op_ToSpreadedFunctionArgument);
    }